

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * flatbuffers::anon_unknown_1::SnakeToSnake2(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  undefined8 local_38;
  size_t i;
  string *s_local;
  string *result;
  
  uVar2 = std::__cxx11::string::length();
  if (uVar2 < 2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::size();
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    local_38 = 0;
    while( true ) {
      lVar3 = std::__cxx11::string::length();
      cVar5 = (char)__return_storage_ptr__;
      if (lVar3 - 1U <= local_38) break;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
      if (*pcVar4 == '_') {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
        iVar1 = isdigit((int)*pcVar4);
        if (iVar1 == 0) goto LAB_001b779f;
      }
      else {
LAB_001b779f:
        std::__cxx11::string::operator[]((ulong)s);
        std::__cxx11::string::push_back(cVar5);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
        iVar1 = isdigit((int)*pcVar4);
        if (iVar1 != 0) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
          iVar1 = isalpha((int)*pcVar4);
          if (iVar1 != 0) {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
            iVar1 = islower((int)*pcVar4);
            if (iVar1 != 0) {
              std::__cxx11::string::push_back(cVar5);
            }
          }
        }
      }
      local_38 = local_38 + 1;
    }
    std::__cxx11::string::back();
    std::__cxx11::string::push_back(cVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SnakeToSnake2(const std::string &s) {
  if (s.length() <= 1) return s;
  std::string result;
  result.reserve(s.size());
  for (size_t i = 0; i < s.length() - 1; i++) {
    if (s[i] == '_' && isdigit(s[i + 1])) {
      continue;  // Move the `_` until after the digits.
    }

    result.push_back(s[i]);

    if (isdigit(s[i]) && isalpha(s[i + 1]) && islower(s[i + 1])) {
      result.push_back('_');
    }
  }
  result.push_back(s.back());

  return result;
}